

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

void Abc_SclShortFormula(SC_Cell *pCell,char *pForm,char *pBuffer)

{
  byte bVar1;
  int iVar2;
  undefined8 *puVar3;
  int i;
  byte *pbVar4;
  size_t __n;
  
  do {
    while( true ) {
      bVar1 = *pForm;
      if (bVar1 == 0) {
        *pBuffer = 0;
        return;
      }
      if ((bVar1 == 0x5f) || (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5))) break;
      *pBuffer = bVar1;
      pBuffer = (char *)((byte *)pBuffer + 1);
      pForm = (char *)((byte *)pForm + 1);
    }
    pbVar4 = (byte *)pForm + -1;
    __n = 0xffffffffffffffff;
    do {
      do {
        bVar1 = pbVar4[1];
        pbVar4 = pbVar4 + 1;
        __n = __n + 1;
      } while (bVar1 == 0x5f);
    } while ((0xf5 < (byte)(bVar1 - 0x3a)) || (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5)));
    for (i = 0; iVar2 = pCell->n_inputs, i < iVar2; i = i + 1) {
      puVar3 = (undefined8 *)Vec_PtrEntry(&pCell->vPins,i);
      iVar2 = strncmp((char *)*puVar3,pForm,__n);
      if (iVar2 == 0) {
        *pBuffer = (char)i + 0x61;
        pBuffer = (char *)((byte *)pBuffer + 1);
        iVar2 = pCell->n_inputs;
        break;
      }
    }
    pForm = (char *)pbVar4;
    if (iVar2 <= i) {
      __assert_fail("i < pCell->n_inputs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclLibUtil.c"
                    ,0x96,"void Abc_SclShortFormula(SC_Cell *, char *, char *)");
    }
  } while( true );
}

Assistant:

void Abc_SclShortFormula( SC_Cell * pCell, char * pForm, char * pBuffer )
{
    SC_Pin * pPin; int i;
    char * pTemp, * pLimit;
    for ( pTemp = pForm; *pTemp; )
    {
        if ( !Abc_SclIsChar(*pTemp) )
        {
            *pBuffer++ = *pTemp++;
            continue;
        }
        pLimit = Abc_SclFindLimit( pTemp );
        SC_CellForEachPinIn( pCell, pPin, i )
            if ( Abc_SclAreEqual( pPin->pName, pTemp, pLimit ) )
            {
                *pBuffer++ = 'a' + i;
                break;
            }
        assert( i < pCell->n_inputs );
        pTemp = pLimit;
    }
    *pBuffer++ = 0;
}